

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_descriptor_sh(miniscript_node_t *node,miniscript_node_t *parent)

{
  int32_t iVar1;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  if (((parent == (miniscript_node_t *)0x0) &&
      (iVar1 = get_child_list_count(node), iVar1 == node->info->inner_num)) &&
     (node->child->info != (miniscript_item_t *)0x0)) {
    node->type_properties = node->child->type_properties;
    return 0;
  }
  return -2;
}

Assistant:

static int verify_descriptor_sh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent || (get_child_list_count(node) != node->info->inner_num) || !node->child->info)
        return WALLY_EINVAL;

    node->type_properties = node->child->type_properties;
    return WALLY_OK;
}